

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O3

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::state_update_alert,libtorrent::aux::stack_allocator&,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,
          vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *args_1)

{
  ushort *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  _Head_base<0UL,_char_*,_false> _Var4;
  long lVar5;
  uint uVar6;
  state_update_alert *this_00;
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> local_48;
  
  lVar5 = (long)this->m_size;
  if ((ulong)(long)this->m_capacity < lVar5 + 0x40U) {
    grow_capacity(this,0x40);
    lVar5 = (long)this->m_size;
  }
  _Var4._M_head_impl =
       (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
       super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  puVar1 = (ushort *)(_Var4._M_head_impl + lVar5);
  uVar6 = -(int)puVar1 - 0x10U & 7;
  _Var4._M_head_impl[lVar5 + 2] = (char)uVar6;
  *(code **)(_Var4._M_head_impl + lVar5 + 8) = move<libtorrent::state_update_alert>;
  this_00 = (state_update_alert *)((long)puVar1 + (ulong)uVar6 + 0x10);
  *(ushort *)(_Var4._M_head_impl + lVar5) = -(short)this_00 - 0x28U & 7 | 0x28;
  local_48.
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (args_1->
       super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (args_1->
       super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_1->
       super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args_1->
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state_update_alert::state_update_alert(this_00,args,&local_48);
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::~vector
            (&local_48);
  uVar2 = this->m_size;
  uVar3 = this->m_num_items;
  this->m_size = uVar6 + 0x10 + (uint)*puVar1 + uVar2;
  this->m_num_items = uVar3 + 1;
  return this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

#ifdef TORRENT_ADDRESS_SANITIZER
			std::size_t const hdr_len = sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(header_t) + pad_bytes + sizeof(U)
					, alignof(header_t));

			int const new_size = m_size + int(sizeof(header_t) + pad_bytes + hdr_len);

			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, ptr
				, m_storage.get() + new_size);
#endif

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U), alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
#ifdef TORRENT_ADDRESS_SANITIZER
			TORRENT_ASSERT(m_size == new_size);
#endif
			return *ret;
		}